

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O0

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
SkipWhitespaceAndComments<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>>
          (GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
           *this,GenericInsituStringStream<rapidjson::UTF8<char>_> *is)

{
  GenericInsituStringStream<rapidjson::UTF8<char>_> *in_stack_00000020;
  
  SkipWhitespace<rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>>(in_stack_00000020);
  return;
}

Assistant:

void SkipWhitespaceAndComments(InputStream& is)
  { SkipWhitespace(is);

    if (parseFlags & kParseCommentsFlag)
    { while (RAPIDJSON_UNLIKELY(Consume(is, '/')))
      { if (Consume(is, '*'))
        { while (true)
          { if (RAPIDJSON_UNLIKELY(is.Peek() == '\0'))
              RAPIDJSON_PARSE_ERROR(kParseErrorUnspecificSyntaxError, is.Tell());
            else if (Consume(is, '*'))
            { if (Consume(is, '/'))
                break;
            }
            else
              is.Take();
          }
        }
        else if (RAPIDJSON_LIKELY(Consume(is, '/')))
          while (is.Peek() != '\0' && is.Take() != '\n');
        else
          RAPIDJSON_PARSE_ERROR(kParseErrorUnspecificSyntaxError, is.Tell());

        SkipWhitespace(is);
      }
    }
  }